

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketManager.cpp
# Opt level: O1

void __thiscall SocketManager::SMMLF::exit_all(SMMLF *this)

{
  int i;
  ulong uVar1;
  
  close(this->serv_sock);
  uVar1 = 0;
  do {
    if (uVar1 != (uint)node_type) {
      close(this->clnt_sock[uVar1]);
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 != 3);
  return;
}

Assistant:

void SocketManager::SMMLF::exit_all() {
    server_exit();
    client_exit();
}